

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

void printIdentifier(ktx_uint8_t *identifier,_Bool json)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  char *__format;
  char u8identifier [30];
  byte local_48 [40];
  
  __format = "\\x%02X";
  if ((int)CONCAT71(in_register_00000031,json) != 0) {
    __format = "\\u%04X";
  }
  uVar5 = 0;
  uVar4 = 0;
  do {
    bVar1 = identifier[uVar5];
    iVar3 = (int)uVar4;
    if (bVar1 == 0xbb) {
      local_48[uVar4] = 0xc2;
      local_48[uVar4 + 1] = 0xbb;
LAB_001e62a5:
      iVar3 = iVar3 + 1;
    }
    else {
      if (bVar1 == 0xab) {
        local_48[uVar4] = 0xc2;
        local_48[uVar4 + 1] = 0xab;
        goto LAB_001e62a5;
      }
      if (bVar1 < 0x20) {
        if (bVar1 == 0xd) {
          local_48[uVar4] = 0x5c;
          local_48[uVar4 + 1] = 0x72;
        }
        else {
          if (bVar1 != 10) {
            iVar2 = snprintf((char *)(local_48 + uVar4),0x1e - uVar4,__format);
            iVar3 = iVar3 + iVar2 + -1;
            goto LAB_001e62a8;
          }
          local_48[uVar4] = 0x5c;
          local_48[uVar4 + 1] = 0x6e;
        }
        goto LAB_001e62a5;
      }
      local_48[uVar4] = bVar1;
    }
LAB_001e62a8:
    uVar4 = (ulong)(iVar3 + 1U);
    if ((10 < uVar5) || (uVar5 = uVar5 + 1, 0x1d < iVar3 + 1U)) {
      fprintf(_stdout,"%.*s",uVar4,local_48);
      return;
    }
  } while( true );
}

Assistant:

void
printIdentifier(const ktx_uint8_t identifier[12], bool json)
{
    // Convert identifier for better display.
    uint32_t idlen = 0;
    char u8identifier[30];
    for (uint32_t i = 0; i < 12 && idlen < sizeof(u8identifier); i++, idlen++) {
        // Convert the angle brackets to utf-8 for better printing. The
        // conversion below only works for characters whose msb's are 10.
        if (identifier[i] == U'\xAB') {
            u8identifier[idlen++] = '\xc2';
            u8identifier[idlen] = identifier[i];
        } else if (identifier[i] == U'\xBB') {
            u8identifier[idlen++] = '\xc2';
            u8identifier[idlen] = identifier[i];
        } else if (identifier[i] < '\x20') {
            uint32_t nchars;
            switch (identifier[i]) {
            case '\n':
                u8identifier[idlen++] = '\\';
                u8identifier[idlen] = 'n';
                break;
            case '\r':
                u8identifier[idlen++] = '\\';
                u8identifier[idlen] = 'r';
                break;
            default:
                nchars = snprintf(&u8identifier[idlen],
                                  sizeof(u8identifier) - idlen,
                                  json ? "\\u%04X" : "\\x%02X",
                                  identifier[i]);
                idlen += nchars - 1;
            }
        } else {
            u8identifier[idlen] = identifier[i];
        }
    }
#if defined(_WIN32)
    if (_isatty(_fileno(stdout)))
        SetConsoleOutputCP(CP_UTF8);
#endif
    fprintf(stdout, "%.*s", idlen, u8identifier);
}